

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  uint32_t key_length;
  Status local_68;
  Slice local_60;
  Slice local_50;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.data_ = key->start_;
  bVar4 = false;
  pNVar3 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
                     (&this->table_,&local_50.data_,(Node **)0x0);
  if (pNVar3 == (Node *)0x0) goto LAB_00643eed;
  pcVar6 = pNVar3->key;
  if (*pcVar6 < '\0') {
    pcVar5 = GetVarint32PtrFallback(pcVar6,pcVar6 + 5,&local_3c);
  }
  else {
    pcVar5 = pcVar6 + 1;
    local_3c = (int)*pcVar6;
  }
  local_50.size_ = (size_t)(local_3c - 8);
  local_60.data_ = key->kstart_;
  local_60.size_ = (size_t)(key->end_ + (-8 - (long)local_60.data_));
  local_50.data_ = pcVar5;
  iVar1 = (*((this->comparator_).comparator.user_comparator_)->_vptr_Comparator[2])();
  if (iVar1 == 0) {
    if (pcVar5[(ulong)local_3c - 8] == '\0') {
      local_50.data_ = "";
      local_50.size_ = 0;
      local_60.data_ = "";
      local_60.size_ = 0;
      Status::Status(&local_68,kNotFound,&local_50,&local_60);
      pcVar6 = s->state_;
      s->state_ = (char *)local_68;
      local_68.state_ = pcVar6;
      if (pcVar6 != (char *)0x0) {
        operator_delete__(pcVar6);
      }
    }
    else {
      if (pcVar5[(ulong)local_3c - 8] != '\x01') goto LAB_00643e48;
      pcVar5 = pcVar5 + local_3c;
      if (*pcVar5 < '\0') {
        pcVar6 = GetVarint32PtrFallback(pcVar5,pcVar5 + 5,(uint32_t *)&local_50);
        uVar2 = (uint)local_50.data_;
      }
      else {
        pcVar6 = pcVar5 + 1;
        uVar2 = (int)*pcVar5;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (value,0,value->_M_string_length,pcVar6,(ulong)uVar2);
    }
    bVar4 = true;
  }
  else {
LAB_00643e48:
    bVar4 = false;
  }
LAB_00643eed:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool MemTable::Get(const LookupKey& key, std::string* value, Status* s) {
  Slice memkey = key.memtable_key();
  Table::Iterator iter(&table_);
  iter.Seek(memkey.data());
  if (iter.Valid()) {
    // entry format is:
    //    klength  varint32
    //    userkey  char[klength]
    //    tag      uint64
    //    vlength  varint32
    //    value    char[vlength]
    // Check that it belongs to same user key.  We do not check the
    // sequence number since the Seek() call above should have skipped
    // all entries with overly large sequence numbers.
    const char* entry = iter.key();
    uint32_t key_length;
    const char* key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
    if (comparator_.comparator.user_comparator()->Compare(
            Slice(key_ptr, key_length - 8), key.user_key()) == 0) {
      // Correct user key
      const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
      switch (static_cast<ValueType>(tag & 0xff)) {
        case kTypeValue: {
          Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
          value->assign(v.data(), v.size());
          return true;
        }
        case kTypeDeletion:
          *s = Status::NotFound(Slice());
          return true;
      }
    }
  }
  return false;
}